

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2019.h
# Opt level: O1

void __thiscall Spaghetti<UFPC>::FirstScan(Spaghetti<UFPC> *this)

{
  char cVar1;
  Mat1b *pMVar2;
  Mat1i *pMVar3;
  uint *puVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  undefined4 uVar12;
  int iVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  long lVar27;
  int iVar28;
  long lVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  long lVar42;
  long lVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  ulong local_b0;
  int local_a8;
  long lVar18;
  
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  uVar25 = *(uint *)&pMVar2->field_0x8;
  uVar26 = *(uint *)&pMVar2->field_0xc;
  *(uint *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74 = uVar25 & 0xfffffffe;
  this->o_rows = (uVar25 & 0x80000001) == 1;
  this->e_cols = uVar26 & 0xfffffffe;
  this->o_cols = (uVar26 & 0x80000001) == 1;
  puVar4 = UFPC::P_;
  *UFPC::P_ = 0;
  UFPC::length_ = 1;
  lVar6 = *(long *)&pMVar2->field_0x10;
  if (uVar25 == 1) {
    lVar31 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar43 = (long)(int)uVar26 + -2;
    uVar25 = 0;
    iVar14 = (int)lVar43;
    if ((int)uVar26 < 3) {
LAB_0014d1b0:
      lVar43 = (long)(int)uVar25;
      if (iVar14 < (int)uVar25) {
        if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_0014d534:
          *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
          return;
        }
      }
      else if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_0014d553:
        lVar43 = (long)(int)uVar25;
        if (*(char *)(lVar6 + 1 + lVar43) != '\0') {
          puVar4[UFPC::length_] = UFPC::length_;
          uVar25 = UFPC::length_ + 1;
          *(uint *)(lVar31 + lVar43 * 4) = UFPC::length_;
          UFPC::length_ = uVar25;
          return;
        }
        *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
        return;
      }
      puVar4[UFPC::length_] = UFPC::length_;
      uVar25 = UFPC::length_ + 1;
      *(uint *)(lVar31 + lVar43 * 4) = UFPC::length_;
      UFPC::length_ = uVar25;
      return;
    }
    uVar26 = 0xfffffffe;
    uVar25 = 0;
LAB_0014d0f7:
    if (*(char *)(lVar6 + (int)uVar25) == '\0') goto LAB_0014d125;
    cVar1 = *(char *)(lVar6 + 3 + (long)(int)uVar26);
    puVar4[UFPC::length_] = UFPC::length_;
    uVar26 = UFPC::length_ + 1;
    *(uint *)(lVar31 + (long)(int)uVar25 * 4) = UFPC::length_;
    UFPC::length_ = uVar26;
    uVar26 = uVar25;
    if (cVar1 == '\0') goto LAB_0014d1a2;
    while (uVar26 = uVar25 + 2, (int)uVar26 < iVar14) {
      uVar11 = (long)(int)uVar25;
      uVar25 = uVar26;
      while (*(char *)(lVar6 + 2 + uVar11) != '\0') {
        if (*(char *)(lVar6 + 3 + uVar11) == '\0') {
          uVar12 = *(undefined4 *)(lVar31 + uVar11 * 4);
          lVar29 = uVar11 + 2;
          goto LAB_0014d19e;
        }
        *(undefined4 *)(lVar31 + 8 + uVar11 * 4) = *(undefined4 *)(lVar31 + uVar11 * 4);
        uVar36 = uVar11 + 2;
        lVar29 = uVar11 + 4;
        uVar25 = uVar25 + 2;
        uVar11 = uVar36;
        if (lVar43 <= lVar29) goto LAB_0014d520;
      }
LAB_0014d125:
      lVar29 = (long)(int)uVar25;
      if (*(char *)(lVar6 + 1 + lVar29) == '\0') goto LAB_0014d189;
      puVar4[UFPC::length_] = UFPC::length_;
      uVar26 = UFPC::length_ + 1;
      *(uint *)(lVar31 + lVar29 * 4) = UFPC::length_;
      UFPC::length_ = uVar26;
    }
    uVar36 = (ulong)uVar25;
    uVar25 = uVar26;
LAB_0014d520:
    lVar43 = (long)(int)uVar25;
    if (iVar14 < (int)uVar25) {
      if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_0014d534;
    }
    else if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_0014d553;
    *(undefined4 *)(lVar31 + lVar43 * 4) = *(undefined4 *)(lVar31 + (long)(int)uVar36 * 4);
    return;
  }
  lVar29 = **(long **)&pMVar2->field_0x48;
  lVar43 = lVar6 + lVar29;
  lVar45 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
  lVar31 = (long)(int)uVar26 + -2;
  uVar11 = 0;
  local_a8 = (int)lVar31;
  if (2 < (int)uVar26) {
    uVar11 = 0;
    do {
      if (*(char *)(lVar6 + (int)uVar11) != '\0') goto LAB_0014d391;
      if (*(char *)(lVar43 + (int)uVar11) != '\0') goto LAB_0014d391;
LAB_0014d233:
      iVar14 = (int)uVar11;
      uVar36 = (ulong)iVar14;
      if ((*(char *)(uVar36 + 1 + lVar6) != '\0') || (*(char *)(lVar43 + 1 + uVar36) != '\0')) {
        puVar4[UFPC::length_] = UFPC::length_;
        uVar35 = UFPC::length_;
        UFPC::length_ = UFPC::length_ + 1;
LAB_0014d25e:
        *(uint *)(lVar45 + uVar36 * 4) = uVar35;
LAB_0014d282:
        lVar37 = (long)(int)uVar11;
        uVar11 = lVar37 + 2;
        if ((int)uVar11 < local_a8) {
          if ((*(char *)(lVar6 + uVar11) != '\0') || (*(char *)(lVar43 + uVar11) != '\0')) {
LAB_0014d29f:
            lVar37 = (long)(int)uVar11;
            cVar1 = *(char *)(lVar6 + 1 + lVar37);
            *(undefined4 *)(lVar45 + lVar37 * 4) = *(undefined4 *)(lVar45 + -8 + lVar37 * 4);
            if (cVar1 == '\0') {
              do {
                iVar14 = (int)uVar11;
                uVar35 = iVar14 + 2;
                if (local_a8 <= (int)uVar35) {
LAB_0014d414:
                  uVar11 = (ulong)uVar35;
                  lVar31 = (long)(int)uVar35;
                  if (local_a8 < (int)uVar35) {
                    if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0'))
                    goto LAB_0014d436;
                  }
                  else {
                    if (*(char *)(lVar6 + lVar31) != '\0') {
                      if (*(char *)(lVar43 + 1 + (long)iVar14) != '\0') goto LAB_0014d594;
                      goto LAB_0014d48b;
                    }
                    if (*(char *)(lVar43 + lVar31) == '\0') goto LAB_0014d5a0;
                  }
                  if (*(char *)(lVar43 + 1 + (long)iVar14) == '\0') goto LAB_0014d4ca;
                  *(undefined4 *)(lVar45 + lVar31 * 4) = *(undefined4 *)(lVar45 + (long)iVar14 * 4);
                  goto LAB_0014d5cb;
                }
                lVar44 = (long)iVar14;
                lVar37 = lVar44 + 2;
                lVar19 = lVar45 + lVar44 * 4;
                lVar42 = lVar6 + lVar29 + 2 + lVar44;
                lVar46 = lVar6 + 2 + lVar44;
                lVar44 = lVar44 << 0x20;
                lVar39 = 0;
                while (*(char *)(lVar46 + lVar39) == '\0') {
                  if (*(char *)(lVar42 + lVar39) == '\0') {
                    uVar11 = (ulong)(uint)((int)lVar37 + (int)lVar39);
                    goto LAB_0014d233;
                  }
                  if (*(char *)(lVar46 + 1 + lVar39) != '\0') {
                    uVar36 = lVar37 + lVar39;
                    if (*(char *)(lVar39 + -1 + lVar42) == '\0') {
                      puVar4[UFPC::length_] = UFPC::length_;
                      uVar35 = UFPC::length_;
                      UFPC::length_ = UFPC::length_ + 1;
                    }
                    else {
                      uVar35 = *(uint *)(lVar19 + lVar39 * 4);
                    }
                    uVar11 = uVar36 & 0xffffffff;
                    goto LAB_0014d25e;
                  }
                  if (*(char *)(lVar42 + -1 + lVar39) == '\0') {
                    puVar4[UFPC::length_] = UFPC::length_;
                    uVar35 = UFPC::length_;
                    UFPC::length_ = UFPC::length_ + 1;
                  }
                  else {
                    uVar35 = *(uint *)(lVar19 + lVar39 * 4);
                  }
                  *(uint *)(lVar19 + 8 + lVar39 * 4) = uVar35;
                  lVar44 = lVar44 + 0x200000000;
                  lVar7 = lVar37 + lVar39;
                  lVar39 = lVar39 + 2;
                  if (lVar31 <= lVar7 + 2) {
                    uVar35 = iVar14 + (int)lVar39 + 2;
                    iVar14 = iVar14 + (int)lVar39;
                    goto LAB_0014d414;
                  }
                }
                if (*(char *)(lVar43 + 1 + (lVar44 >> 0x20)) != '\0') goto code_r0x0014d356;
                uVar11 = lVar37 + lVar39 & 0xffffffff;
LAB_0014d391:
                cVar1 = *(char *)(lVar6 + 1 + (long)(int)uVar11);
                puVar4[UFPC::length_] = UFPC::length_;
                uVar35 = UFPC::length_ + 1;
                *(uint *)(lVar45 + (long)(int)uVar11 * 4) = UFPC::length_;
                UFPC::length_ = uVar35;
                if (cVar1 != '\0') break;
              } while( true );
            }
            goto LAB_0014d282;
          }
          goto LAB_0014d233;
        }
        if (local_a8 < (int)uVar11) {
          if ((*(char *)(lVar6 + uVar11) == '\0') && (*(char *)(lVar43 + uVar11) == '\0')) {
            *(undefined4 *)(lVar45 + 8 + lVar37 * 4) = 0;
          }
          else {
            *(undefined4 *)(lVar45 + 8 + lVar37 * 4) = *(undefined4 *)(lVar45 + lVar37 * 4);
          }
        }
        else {
          if ((*(char *)(lVar6 + uVar11) == '\0') && (*(char *)(lVar43 + uVar11) == '\0'))
          goto LAB_0014d5a0;
LAB_0014d594:
          *(undefined4 *)(lVar45 + (long)(int)uVar11 * 4) =
               *(undefined4 *)(lVar45 + -8 + (long)(int)uVar11 * 4);
        }
        goto LAB_0014d5cb;
      }
      *(undefined4 *)(lVar45 + (long)iVar14 * 4) = 0;
      uVar11 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_a8);
  }
  uVar35 = (uint)uVar11;
  lVar31 = (long)(int)uVar35;
  if (local_a8 < (int)uVar35) {
    if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0')) {
LAB_0014d436:
      *(undefined4 *)(lVar45 + lVar31 * 4) = 0;
    }
    else {
LAB_0014d4ca:
      puVar4[UFPC::length_] = UFPC::length_;
      uVar35 = UFPC::length_ + 1;
      *(uint *)(lVar45 + lVar31 * 4) = UFPC::length_;
      UFPC::length_ = uVar35;
    }
  }
  else if ((*(char *)(lVar6 + lVar31) == '\0') && (*(char *)(lVar43 + lVar31) == '\0')) {
LAB_0014d5a0:
    lVar31 = (long)(int)uVar11;
    if ((*(char *)(lVar31 + 1 + lVar6) == '\0') && (*(char *)(lVar43 + 1 + lVar31) == '\0')) {
      *(undefined4 *)(lVar45 + lVar31 * 4) = 0;
    }
    else {
      puVar4[UFPC::length_] = UFPC::length_;
      uVar35 = UFPC::length_ + 1;
      *(uint *)(lVar45 + lVar31 * 4) = UFPC::length_;
      UFPC::length_ = uVar35;
    }
  }
  else {
LAB_0014d48b:
    puVar4[UFPC::length_] = UFPC::length_;
    uVar5 = UFPC::length_ + 1;
    *(uint *)(lVar45 + (long)(int)uVar35 * 4) = UFPC::length_;
    UFPC::length_ = uVar5;
  }
LAB_0014d5cb:
  if (2 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74) {
    lVar6 = (long)local_a8;
    lVar29 = 2;
    lVar31 = 1;
    lVar45 = 3;
    lVar43 = 0;
    do {
      pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
      pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
      lVar42 = *(long *)&pMVar2->field_0x10;
      lVar46 = **(long **)&pMVar2->field_0x48;
      lVar33 = lVar46 * lVar29;
      lVar37 = lVar42 + lVar33;
      lVar27 = lVar37 - lVar46;
      lVar19 = lVar37 + lVar46;
      lVar39 = *(long *)&pMVar3->field_0x10;
      lVar44 = **(long **)&pMVar3->field_0x48;
      lVar7 = lVar44 * lVar29;
      lVar40 = lVar39 + lVar7;
      lVar24 = lVar40 + lVar44 * -2;
      cVar1 = *(char *)(lVar42 + lVar33);
      if (2 < (int)uVar26) {
        lVar20 = lVar27 - lVar46;
        local_b0 = 0;
        uVar11 = 0;
        if (cVar1 == '\0') goto LAB_0014d749;
LAB_0014d6a9:
        local_b0 = uVar11;
        lVar21 = (long)(int)local_b0;
        if (*(char *)(lVar21 + 1 + lVar27) == '\0') {
          if (*(char *)(lVar37 + 1 + lVar21) != '\0') goto LAB_0014d7cb;
          if (*(char *)(lVar27 + lVar21) == '\0') {
            UFPC::P_[UFPC::length_] = UFPC::length_;
            uVar35 = UFPC::length_ + 1;
            *(uint *)(lVar40 + lVar21 * 4) = UFPC::length_;
            UFPC::length_ = uVar35;
            goto LAB_0014dc8d;
          }
          *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
          goto LAB_0014e50b;
        }
        *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
LAB_0014fa79:
        iVar14 = (int)local_b0;
        uVar35 = iVar14 + 2;
        if ((int)uVar35 < local_a8) {
          lVar15 = (long)iVar14;
          lVar21 = lVar15 + 2;
          lVar38 = lVar46 * lVar45 + lVar15;
          lVar34 = lVar46 * lVar31 + lVar15;
          lVar32 = lVar7 + lVar15 * 4;
          lVar9 = lVar44 * lVar43 + lVar15 * 4;
          lVar16 = lVar15 << 0x20;
          lVar8 = lVar42 + lVar33 + lVar15;
          lVar23 = lVar42 + 2 + lVar34;
          lVar22 = lVar32 + lVar39 + 8;
          lVar41 = lVar39 + lVar9 + 8;
          lVar10 = 0;
          do {
            lVar17 = lVar16 >> 0x1e;
            lVar18 = lVar16 >> 0x20;
            if (*(char *)(lVar8 + 2 + lVar10) == '\0') {
              local_b0 = lVar21 + lVar10;
              if (*(char *)(lVar10 + 2 + lVar38 + lVar42) == '\0') goto LAB_0014d7a3;
              lVar21 = lVar16 + 0x300000000 >> 0x20;
              lVar8 = lVar16 + 0x100000000 >> 0x20;
              if (*(char *)(lVar37 + lVar21) != '\0') {
                if (*(char *)(lVar37 + lVar8) != '\0') goto LAB_0014fde7;
                uVar11 = local_b0;
                if (*(char *)(lVar19 + lVar8) == '\0') goto LAB_0014d7b4;
                if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014fdf8;
                if (*(char *)(lVar27 + 4 + lVar18) != '\0') goto LAB_0014f370;
                if (*(char *)(lVar10 + 2 + lVar34 + lVar42) == '\0') {
                  *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar18 * 4);
                  goto LAB_0014e645;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) =
                     *(undefined4 *)(lVar9 + lVar39 + 8 + lVar10 * 4);
                goto LAB_0014d814;
              }
              if (*(char *)(lVar19 + lVar8) != '\0') {
                *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar17)
                ;
                goto LAB_0014dfc6;
              }
              if (*(char *)(lVar37 + lVar8) == '\0') {
                UFPC::P_[UFPC::length_] = UFPC::length_;
                uVar35 = UFPC::length_ + 1;
                *(uint *)(lVar32 + lVar39 + 8 + lVar10 * 4) = UFPC::length_;
                UFPC::length_ = uVar35;
                goto LAB_0014dfc6;
              }
              *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) = *(undefined4 *)(lVar40 + lVar17);
              goto LAB_0014dfc6;
            }
            iVar28 = (int)lVar21;
            if ((*(char *)(lVar8 + 1 + lVar10) != '\0') ||
               (*(char *)(lVar42 + lVar38 + 1 + lVar10) != '\0')) {
              local_b0 = (ulong)(uint)(iVar28 + (int)lVar10);
              goto LAB_0014f31c;
            }
            if (*(char *)(lVar23 + 1 + lVar10) == '\0') {
              local_b0 = lVar21 + lVar10;
              if (*(char *)(lVar10 + 3 + lVar33 + lVar15 + lVar42) == '\0') {
                if (*(char *)(lVar10 + 2 + lVar34 + lVar42) == '\0') {
                  *(undefined4 *)(lVar32 + lVar39 + 8 + lVar10 * 4) =
                       *(undefined4 *)(lVar24 + lVar17);
                  local_b0 = local_b0 & 0xffffffff;
                  goto LAB_0014dc8d;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar41 + lVar10 * 4);
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_0014e50b;
              }
              cVar1 = *(char *)(lVar10 + 2 + lVar34 + lVar42);
              if (*(char *)(lVar27 + 4 + lVar18) == '\0') {
                if (cVar1 == '\0') {
                  *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar24 + lVar18 * 4);
                  goto LAB_0014e645;
                }
                *(undefined4 *)(lVar22 + lVar10 * 4) =
                     *(undefined4 *)(lVar9 + lVar39 + 8 + lVar10 * 4);
                goto LAB_0014d814;
              }
              if (cVar1 == '\0') goto LAB_001500f3;
LAB_0014d7e8:
              lVar21 = (long)(int)local_b0;
              if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
                uVar35 = *(uint *)(lVar24 + lVar21 * 4);
                uVar5 = *(uint *)(lVar24 + 8 + lVar21 * 4);
                goto LAB_0014f6d0;
              }
LAB_0014d7fb:
              uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
LAB_0014f706:
              *(uint *)(lVar40 + lVar21 * 4) = uVar35;
LAB_0014e8b5:
              iVar14 = (int)local_b0;
              uVar35 = iVar14 + 2;
              if ((int)uVar35 < local_a8) {
                lVar16 = (long)iVar14;
                lVar10 = lVar16 << 0x20;
                lVar21 = lVar42 + lVar33 + lVar16;
                lVar23 = lVar21 + 3;
                lVar8 = lVar46 * lVar31 + lVar16 + lVar42;
                lVar32 = lVar39 + lVar44 * lVar43 + lVar16 * 4;
                lVar34 = lVar32 + 8;
                lVar9 = lVar7 + lVar16 * 4;
                lVar15 = lVar39 + lVar9 + 8;
                lVar22 = 0;
                while( true ) {
                  lVar38 = lVar10 >> 0x1e;
                  iVar28 = (int)(lVar16 + 2);
                  iVar13 = (int)lVar22;
                  if (*(char *)(lVar21 + 2 + lVar22) == '\0') {
                    if (*(char *)(lVar46 * lVar45 + lVar16 + lVar42 + 2 + lVar22) == '\0') {
                      local_b0 = lVar16 + 2 + lVar22;
                      lVar21 = lVar10 + 0x300000000 >> 0x20;
                      if (*(char *)(lVar37 + lVar21) == '\0') {
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014da28;
                      }
                      if (*(char *)(lVar27 + lVar21) != '\0') {
                        *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                        goto LAB_0014f28f;
                      }
                      if (*(char *)(lVar27 + 4 + (lVar10 >> 0x20)) == '\0') {
                        *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014d814;
                      }
                      local_b0 = local_b0 & 0xffffffff;
                      goto LAB_0014d7e8;
                    }
                    if (*(char *)(lVar23 + lVar22) == '\0') {
                      *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) =
                           *(undefined4 *)(lVar40 + lVar38);
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      goto LAB_0014dfc6;
                    }
                    if (*(char *)(lVar8 + 3 + lVar22) != '\0') {
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                      goto LAB_0014f28f;
                    }
                  }
                  else {
                    if (*(char *)(lVar8 + 3 + lVar22) != '\0') {
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      *(undefined4 *)(lVar15 + lVar22 * 4) = *(undefined4 *)(lVar34 + lVar22 * 4);
                      goto LAB_0014fa79;
                    }
                    if (*(char *)(lVar23 + lVar22) == '\0') {
                      *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) =
                           *(undefined4 *)(lVar40 + lVar38);
                      local_b0 = (ulong)(uint)(iVar28 + iVar13);
                      goto LAB_0014f3fb;
                    }
                  }
                  if (*(char *)(lVar8 + 4 + lVar22) == '\0') break;
                  uVar35 = *(uint *)(lVar32 + 0x10 + lVar22 * 4);
                  if (*(char *)(lVar46 * lVar43 + lVar16 + lVar42 + 3 + lVar22) == '\0') {
                    uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar39 + lVar9 + lVar22 * 4));
                  }
                  *(uint *)(lVar15 + lVar22 * 4) = uVar35;
                  lVar10 = lVar10 + 0x200000000;
                  lVar38 = lVar22 + lVar16;
                  lVar22 = lVar22 + 2;
                  if (lVar6 <= lVar38 + 4) {
                    iVar14 = iVar14 + (int)lVar22;
                    uVar35 = iVar28 + (int)lVar22;
                    goto LAB_0014eacb;
                  }
                }
                *(undefined4 *)(lVar9 + lVar39 + 8 + lVar22 * 4) = *(undefined4 *)(lVar40 + lVar38);
                local_b0 = (ulong)(uint)(iVar28 + iVar13);
LAB_0014ecb5:
                iVar14 = (int)local_b0;
                uVar35 = iVar14 + 2;
                if ((int)uVar35 < local_a8) {
                  lVar8 = (long)iVar14;
                  lVar21 = lVar8 + 2;
                  lVar9 = lVar8 << 0x20;
                  lVar32 = lVar7 + lVar8 * 4;
                  lVar23 = lVar39 + lVar32 + 8;
                  lVar10 = lVar33 + lVar8 + lVar42;
                  lVar15 = lVar10 + 3;
                  lVar16 = lVar46 * lVar31 + lVar8 + lVar42;
                  lVar22 = 0;
                  do {
                    lVar38 = lVar9 >> 0x20;
                    lVar34 = lVar9 >> 0x1e;
                    iVar13 = (int)lVar22;
                    iVar28 = (int)lVar21;
                    if (*(char *)(lVar10 + 2 + lVar22) == '\0') {
                      if (*(char *)(lVar42 + lVar46 * lVar45 + lVar8 + 2 + lVar22) == '\0') {
                        local_b0 = (ulong)(uint)(iVar28 + iVar13);
                        goto LAB_0014e83f;
                      }
                      if (*(char *)(lVar15 + lVar22) == '\0') {
                        *(undefined4 *)(lVar32 + lVar39 + 8 + lVar22 * 4) =
                             *(undefined4 *)(lVar40 + lVar34);
                        local_b0 = (ulong)(uint)(iVar28 + iVar13);
                        goto LAB_0014dfc6;
                      }
                      if (*(char *)(lVar16 + 3 + lVar22) != '\0') {
                        local_b0 = lVar21 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) == '\0') {
                          uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                        lVar22 * 4),*(uint *)(lVar40 + lVar34));
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                          goto LAB_0014f28f;
                        }
                        if (*(char *)(lVar27 + lVar38) != '\0') goto LAB_0014f081;
                        uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                      lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4));
                        *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        goto LAB_0014f28f;
                      }
                    }
                    else {
                      if (*(char *)(lVar16 + 3 + lVar22) != '\0') {
                        local_b0 = lVar21 + lVar22;
                        if (*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) == '\0') {
                          uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                        lVar22 * 4),*(uint *)(lVar40 + lVar34));
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        }
                        else {
                          if (*(char *)(lVar27 + lVar38) != '\0') goto LAB_0014ef3d;
                          uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 8 +
                                                        lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4));
                          *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                        }
                        goto LAB_0014fa79;
                      }
                      if (*(char *)(lVar15 + lVar22) == '\0') goto LAB_0014ef5e;
                    }
                    if (*(char *)(lVar16 + 4 + lVar22) != '\0') {
                      local_b0 = lVar21 + lVar22;
                      if (*(char *)(lVar20 + 3 + lVar38) == '\0') {
                        uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 0x10 +
                                                      lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4));
                      }
                      else {
                        if ((*(char *)(lVar22 + 2 + lVar46 * lVar43 + lVar8 + lVar42) != '\0') &&
                           (*(char *)(lVar27 + lVar38) != '\0')) goto LAB_0014eea9;
                        uVar35 = UFPC::Merge(*(uint *)(lVar44 * lVar43 + lVar8 * 4 + lVar39 + 0x10 +
                                                      lVar22 * 4),*(uint *)(lVar40 + lVar38 * 4));
                      }
                      *(uint *)(lVar23 + lVar22 * 4) = uVar35;
                      local_b0 = local_b0 & 0xffffffff;
                      goto LAB_0014e8b5;
                    }
                    *(undefined4 *)(lVar23 + lVar22 * 4) =
                         *(undefined4 *)(lVar39 + lVar32 + lVar22 * 4);
                    lVar9 = lVar9 + 0x200000000;
                    lVar34 = lVar21 + lVar22;
                    lVar22 = lVar22 + 2;
                    if (lVar6 <= lVar34 + 2) {
                      iVar14 = iVar14 + (int)lVar22;
                      uVar35 = iVar28 + (int)lVar22;
                      break;
                    }
                  } while( true );
                }
                uVar11 = (ulong)uVar35;
                if (local_a8 < (int)uVar35) goto LAB_0014f2ca;
                lVar42 = (long)iVar14;
                if (*(char *)(lVar37 + uVar11) == '\0') {
                  local_b0 = uVar11;
                  if (*(char *)(lVar19 + uVar11) == '\0') {
LAB_0014eed1:
                    uVar35 = (uint)local_b0;
                    local_b0 = (ulong)(int)uVar35;
                    if (*(char *)(local_b0 + 1 + lVar37) == '\0') goto LAB_0014fcf0;
                    cVar1 = *(char *)(lVar27 + 1 + local_b0);
                    goto joined_r0x0014eeee;
                  }
                  if (*(char *)(lVar37 + 3 + lVar42) != '\0') goto LAB_0014ee13;
                }
                else {
LAB_0014ee13:
                  if (*(char *)(lVar27 + 3 + lVar42) != '\0') {
                    local_b0 = uVar11;
                    if (*(char *)(lVar20 + uVar11) == '\0') {
                      uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                      uVar5 = *(uint *)(lVar40 + lVar42 * 4);
                    }
                    else {
LAB_0014f5ed:
                      uVar11 = (ulong)(int)local_b0;
                      if (*(char *)((uVar11 - 2) + lVar27) == '\0') {
                        uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                      }
                      else {
LAB_0014f5f7:
                        uVar11 = (ulong)(int)local_b0;
                        uVar35 = *(uint *)(lVar24 + uVar11 * 4);
                        if (*(char *)(lVar20 + -1 + uVar11) != '\0') {
                          *(uint *)(lVar40 + uVar11 * 4) = uVar35;
                          goto LAB_0014fd2a;
                        }
                      }
                      uVar5 = *(uint *)(lVar40 + -8 + uVar11 * 4);
                    }
LAB_0014f626:
                    uVar35 = UFPC::Merge(uVar35,uVar5);
                    *(uint *)(lVar40 + uVar11 * 4) = uVar35;
                    goto LAB_0014fd2a;
                  }
                }
                uVar12 = *(undefined4 *)(lVar40 + lVar42 * 4);
                goto LAB_0014fc3f;
              }
LAB_0014eacb:
              local_b0 = (ulong)uVar35;
              uVar11 = local_b0;
              if (local_a8 < (int)uVar35) {
LAB_0014f2ca:
                local_b0 = (ulong)(int)uVar11;
                if (*(char *)(lVar37 + local_b0) != '\0') goto LAB_0014fc48;
LAB_0014f2d7:
                local_b0 = (ulong)(int)uVar11;
                if (*(char *)(lVar19 + local_b0) != '\0') goto LAB_0014fc48;
                goto LAB_0014fd1d;
              }
              lVar42 = (long)iVar14;
              if (*(char *)(lVar37 + local_b0) == '\0') {
                cVar1 = *(char *)(lVar37 + 3 + lVar42);
                if (*(char *)(lVar19 + local_b0) == '\0') {
                  if (cVar1 != '\0') goto LAB_0014d6e2;
                  goto LAB_0014fcf0;
                }
                if (cVar1 == '\0') goto LAB_0014fd5c;
              }
              if (*(char *)(lVar27 + 3 + lVar42) != '\0') goto LAB_0014d6e2;
              goto LAB_0014fd5c;
            }
            if (*(char *)(lVar23 + lVar10) == '\0') goto LAB_0014fe8b;
            *(undefined4 *)(lVar22 + lVar10 * 4) = *(undefined4 *)(lVar41 + lVar10 * 4);
            lVar16 = lVar16 + 0x200000000;
            lVar17 = lVar21 + lVar10;
            lVar10 = lVar10 + 2;
            if (lVar6 <= lVar17 + 2) {
              iVar14 = iVar14 + (int)lVar10;
              uVar35 = iVar28 + (int)lVar10;
              break;
            }
          } while( true );
        }
        local_b0 = (ulong)uVar35;
        if (local_a8 < (int)uVar35) {
          if (*(char *)(lVar37 + local_b0) == '\0') {
            if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014fd1d;
LAB_0014fd49:
            if ((*(char *)(lVar19 + (ulong)(iVar14 + 1)) != '\0') ||
               (*(char *)(lVar37 + (ulong)(iVar14 + 1)) != '\0')) goto LAB_0014fd59;
            goto LAB_0014fcfa;
          }
          if ((*(char *)(lVar37 + (ulong)(iVar14 + 1)) == '\0') &&
             (*(char *)(lVar19 + (ulong)(iVar14 + 1)) == '\0')) {
LAB_0014ffe4:
            if (*(char *)(lVar27 + local_b0) == '\0') {
              uVar12 = *(undefined4 *)(lVar24 + (long)iVar14 * 4);
              goto LAB_0014fc4d;
            }
            goto LAB_0014d6e2;
          }
LAB_0014fd59:
          lVar42 = (long)iVar14;
LAB_0014fd5c:
          uVar12 = *(undefined4 *)(lVar40 + lVar42 * 4);
          goto LAB_0014fc4d;
        }
        if (*(char *)(lVar37 + local_b0) == '\0') {
          uVar30 = local_b0;
          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014fcdc;
          if (*(char *)(lVar37 + (ulong)(iVar14 + 3)) == '\0') goto LAB_0014fd49;
          if (*(char *)(lVar37 + (ulong)(iVar14 + 1)) != '\0') goto LAB_0014fc28;
          if (*(char *)(lVar19 + (ulong)(iVar14 + 1)) != '\0') {
            if (*(char *)(lVar27 + (ulong)(iVar14 + 3)) == '\0') {
              if (*(char *)(lVar27 + local_b0) == '\0') goto LAB_0014fd59;
              goto LAB_0014d6e2;
            }
            goto LAB_0014fc32;
          }
          goto LAB_0014d672;
        }
        if ((*(char *)(lVar37 + (ulong)(iVar14 + 1)) == '\0') &&
           (*(char *)(lVar19 + (ulong)(iVar14 + 1)) == '\0')) {
          if (*(char *)(lVar27 + 3 + (long)iVar14) == '\0') goto LAB_0014ffe4;
          if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0014d6e2;
LAB_0014ffca:
          uVar11 = (ulong)(int)uVar35;
          if (*(char *)(lVar20 + uVar11) != '\0') goto LAB_0014fc3b;
          uVar5 = *(uint *)(lVar24 + -8 + uVar11 * 4);
          uVar35 = *(uint *)(lVar24 + uVar11 * 4);
LAB_0014e1f7:
          uVar35 = UFPC::Merge(uVar5,uVar35);
          *(uint *)(lVar40 + uVar11 * 4) = uVar35;
        }
        else {
LAB_0014fc28:
          uVar35 = (uint)local_b0;
          local_b0 = (ulong)(int)uVar35;
          if (*(char *)(lVar27 + 1 + local_b0) == '\0') {
LAB_0014fc48:
            uVar12 = *(undefined4 *)(lVar40 + -8 + local_b0 * 4);
            goto LAB_0014fc4d;
          }
LAB_0014fc32:
          uVar11 = (ulong)(int)uVar35;
          if (*(char *)(lVar27 + uVar11) == '\0') {
            uVar5 = *(uint *)(lVar24 + uVar11 * 4);
            if (*(char *)(lVar20 + uVar11) == '\0') {
LAB_0014e1f2:
              uVar35 = *(uint *)(lVar40 + -8 + uVar11 * 4);
              goto LAB_0014e1f7;
            }
            *(uint *)(lVar40 + uVar11 * 4) = uVar5;
          }
          else {
LAB_0014fc3b:
            uVar12 = *(undefined4 *)(lVar24 + uVar11 * 4);
LAB_0014fc3f:
            *(undefined4 *)(lVar40 + uVar11 * 4) = uVar12;
          }
        }
        goto LAB_0014fd2a;
      }
      if (uVar26 == 2) {
        uVar30 = 0;
        uVar35 = 0;
        if (cVar1 == '\0') {
LAB_0014db1e:
          uVar35 = (uint)uVar30;
          local_b0 = (ulong)(int)uVar35;
          if (*(char *)(lVar19 + local_b0) == '\0') {
LAB_0014fcdc:
            local_b0 = uVar30 & 0xffffffff;
LAB_0014fcdf:
            uVar35 = (uint)local_b0;
            if (*(char *)(lVar37 + 1 + (long)(int)uVar35) != '\0') goto LAB_0014d672;
LAB_0014fcf0:
            local_b0 = (ulong)(int)uVar35;
            if (*(char *)(lVar19 + 1 + local_b0) == '\0') goto LAB_0014fd1d;
          }
          else if (*(char *)(lVar37 + 1 + local_b0) != '\0') goto LAB_0014d672;
LAB_0014fcfa:
          UFPC::P_[UFPC::length_] = UFPC::length_;
          uVar35 = UFPC::length_ + 1;
          *(uint *)(lVar40 + local_b0 * 4) = UFPC::length_;
          UFPC::length_ = uVar35;
        }
        else {
LAB_0014d672:
          local_b0 = (ulong)(int)uVar35;
          uVar36 = (ulong)uVar35;
          if (*(char *)(lVar27 + 1 + local_b0) == '\0') goto LAB_0014d6d5;
LAB_0014d6e2:
          uVar12 = *(undefined4 *)(lVar24 + local_b0 * 4);
LAB_0014fc4d:
          *(undefined4 *)(lVar40 + local_b0 * 4) = uVar12;
        }
      }
      else {
        uVar30 = 0;
        uVar36 = 0;
        if (cVar1 != '\0') {
LAB_0014d6d5:
          local_b0 = (ulong)(int)uVar36;
          cVar1 = *(char *)(lVar27 + local_b0);
joined_r0x0014eeee:
          if (cVar1 == '\0') goto LAB_0014fcfa;
          goto LAB_0014d6e2;
        }
LAB_0014dacd:
        local_b0 = (ulong)(int)uVar30;
        if (*(char *)(lVar19 + local_b0) != '\0') goto LAB_0014fcfa;
LAB_0014fd1d:
        *(undefined4 *)(lVar40 + local_b0 * 4) = 0;
      }
LAB_0014fd2a:
      lVar29 = lVar29 + 2;
      lVar31 = lVar31 + 2;
      lVar43 = lVar43 + 2;
      lVar45 = lVar45 + 2;
    } while ((int)lVar29 < *(int *)&(this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74);
  }
  if (this->o_rows == false) {
    return;
  }
  pMVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar3 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  lVar43 = *(long *)&pMVar2->field_0x10;
  lVar29 = **(long **)&pMVar2->field_0x48;
  lVar19 = (long)(int)(uVar25 - 1);
  lVar6 = lVar43 + lVar29 * lVar19;
  lVar46 = lVar6 - lVar29;
  lVar45 = *(long *)&pMVar3->field_0x10;
  lVar37 = **(long **)&pMVar3->field_0x48;
  lVar31 = lVar45 + lVar37 * lVar19;
  lVar42 = lVar31 + lVar37 * -2;
  uVar11 = 0;
  if (2 < (int)uVar26) {
    lVar27 = lVar46 - lVar29;
    lVar33 = (long)local_a8;
    lVar7 = lVar37 * lVar19 + lVar45 + 8;
    lVar24 = (lVar19 + -1) * lVar29;
    lVar40 = lVar24 + lVar43 + 4;
    lVar44 = lVar29 * lVar19 + lVar43 + 3;
    lVar39 = lVar29 * (lVar19 + -2) + lVar43 + 3;
    lVar29 = lVar37 * (lVar19 + -2) + lVar45 + 0x10;
    iVar14 = -2;
    uVar11 = 0;
    do {
      lVar45 = (long)(int)uVar11;
      uVar36 = uVar11;
      if (*(char *)(lVar6 + lVar45) == '\0') goto LAB_00150416;
      if (*(char *)((long)iVar14 + 3 + lVar46) != '\0') {
        *(undefined4 *)(lVar31 + lVar45 * 4) = *(undefined4 *)(lVar42 + lVar45 * 4);
        goto LAB_00150b8b;
      }
      if (*(char *)(lVar6 + 3 + (long)iVar14) != '\0') {
LAB_00150430:
        uVar11 = (ulong)(int)uVar36;
        if (*(char *)(lVar46 + 2 + uVar11) != '\0') {
          if (*(char *)(lVar46 + uVar11) != '\0') goto LAB_00150447;
          goto LAB_00150777;
        }
        if (*(char *)(lVar46 + uVar11) == '\0') goto LAB_00150782;
LAB_00150472:
        *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + uVar11 * 4);
        lVar45 = (long)(int)uVar36;
        uVar11 = lVar45 + 2;
        uVar25 = (uint)uVar11;
        if ((int)uVar25 < local_a8) {
          uVar36 = uVar11;
          if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_0015072c;
          if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
            if (*(char *)(lVar27 + uVar11) == '\0') {
              uVar25 = UFPC::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),*(uint *)(lVar31 + lVar45 * 4)
                                  );
              *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
              goto LAB_00150b8b;
            }
LAB_00150a45:
            lVar45 = (long)(int)uVar11;
            cVar1 = *(char *)(lVar27 + -1 + lVar45);
            goto joined_r0x00150a58;
          }
          if (*(char *)(lVar6 + 3 + lVar45) != '\0') {
            if (*(char *)(lVar45 + 4 + lVar46) == '\0') {
              *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = *(undefined4 *)(lVar31 + lVar45 * 4);
              goto LAB_0015097f;
            }
            if ((*(char *)(lVar27 + 3 + lVar45) == '\0') || (*(char *)(lVar27 + uVar11) == '\0')) {
              uVar25 = UFPC::Merge(*(uint *)(lVar42 + 0x10 + lVar45 * 4),
                                   *(uint *)(lVar31 + lVar45 * 4));
              *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
              goto LAB_001507a4;
            }
LAB_00150ac1:
            lVar45 = (long)(int)uVar11;
            uVar36 = uVar11;
            if (*(char *)(lVar27 + -1 + lVar45) != '\0') goto LAB_00150460;
            uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
            uVar26 = *(uint *)(lVar31 + -8 + lVar45 * 4);
LAB_00150533:
            uVar25 = UFPC::Merge(uVar25,uVar26);
            do {
              *(uint *)(lVar31 + lVar45 * 4) = uVar25;
              uVar11 = uVar36;
LAB_001507a4:
              iVar14 = (int)uVar11;
              uVar25 = iVar14 + 2;
              if (local_a8 <= (int)uVar25) {
LAB_00150f21:
                if (local_a8 < (int)uVar25) {
                  uVar11 = (ulong)uVar25;
                  goto LAB_00150f29;
                }
                lVar43 = (long)(int)uVar25;
                lVar29 = (long)iVar14;
                if (*(char *)(lVar6 + lVar43) == '\0') {
                  if (*(char *)(lVar6 + 3 + lVar29) != '\0') goto LAB_00151123;
                  goto LAB_00151131;
                }
                if (*(char *)(lVar46 + 3 + lVar29) != '\0') goto LAB_00151123;
LAB_00150f93:
                uVar12 = *(undefined4 *)(lVar31 + lVar29 * 4);
                goto LAB_00151128;
              }
              lVar20 = (long)iVar14;
              lVar21 = lVar20 << 0x20;
              lVar45 = lVar7 + lVar20 * 4;
              lVar37 = lVar40 + lVar20;
              lVar19 = lVar29 + lVar20 * 4;
              lVar32 = 0;
LAB_001507f9:
              if (*(char *)(lVar44 + lVar20 + -1 + lVar32) != '\0') {
                iVar28 = (int)lVar32;
                if (*(char *)(lVar37 + -1 + lVar32) != '\0') {
                  uVar11 = (ulong)(iVar14 + iVar28 + 2);
                  *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar19 + -8 + lVar32 * 4);
                  goto LAB_00150b8b;
                }
                if (*(char *)(lVar44 + lVar20 + lVar32) != '\0') goto code_r0x0015081d;
                uVar25 = iVar14 + iVar28 + 2;
                *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar31 + (lVar21 >> 0x1e));
LAB_00150a79:
                uVar11 = (ulong)uVar25;
                goto LAB_00150dff;
              }
              uVar36 = (uVar11 & 0xffffffff) + lVar32 + 2;
              iVar14 = (int)uVar36;
              lVar45 = lVar21 + 0x300000000 >> 0x20;
              uVar11 = lVar20 + 2 + lVar32;
              if (*(char *)(lVar6 + lVar45) == '\0') goto LAB_00150572;
              if (*(char *)(lVar46 + lVar45) != '\0') {
LAB_00150742:
                do {
                  *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + uVar11 * 4);
                  uVar11 = (long)(int)uVar36 + 2;
                  if (local_a8 <= (int)uVar11) {
                    if (local_a8 < (int)uVar11) goto LAB_00150f29;
                    if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00151104;
LAB_00150f57:
                    lVar43 = (long)(int)uVar11;
                    if (*(char *)(lVar46 + 1 + lVar43) == '\0') {
                      uVar25 = *(uint *)(lVar31 + -8 + lVar43 * 4);
                      goto LAB_001511bf;
                    }
                    if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_00150f71;
                    uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                    if (*(char *)(lVar27 + lVar43) != '\0') {
                      *(uint *)(lVar31 + lVar43 * 4) = uVar25;
                      return;
                    }
                    uVar26 = *(uint *)(lVar31 + -8 + lVar43 * 4);
                    goto LAB_001511ba;
                  }
                  uVar36 = uVar11;
                  if (*(char *)(lVar6 + uVar11) != '\0') goto LAB_00150c1d;
LAB_00150416:
                  iVar14 = (int)uVar36;
                  uVar11 = (ulong)iVar14;
                  if (*(char *)(uVar11 + 1 + lVar6) == '\0') {
                    while( true ) {
                      uVar11 = (ulong)iVar14;
LAB_00150572:
                      *(undefined4 *)(lVar31 + uVar11 * 4) = 0;
                      lVar45 = (long)iVar14;
                      uVar11 = lVar45 + 2;
                      if (local_a8 <= (int)uVar11) break;
                      uVar36 = uVar11;
                      if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00150416;
                      if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
                        if ((*(char *)(lVar46 + uVar11) == '\0') &&
                           (*(char *)(lVar46 + 1 + lVar45) != '\0')) goto LAB_00150ce5;
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                             *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
                        goto LAB_00150b8b;
                      }
                      if (*(char *)(lVar6 + 3 + lVar45) == '\0') {
                        if (*(char *)(lVar46 + uVar11) == '\0') {
                          if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar25 = UFPC::length_ + 1;
                            *(uint *)(lVar31 + 8 + lVar45 * 4) = UFPC::length_;
                            UFPC::length_ = uVar25;
                            goto LAB_00150dff;
                          }
                          uVar12 = *(undefined4 *)(lVar42 + lVar45 * 4);
                        }
                        else {
                          uVar12 = *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = uVar12;
                        goto LAB_00150dff;
                      }
                      cVar1 = *(char *)(lVar45 + 2 + lVar46);
                      if (*(char *)(lVar45 + 4 + lVar46) != '\0') {
                        if (cVar1 != '\0') goto LAB_00150447;
                        if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                               *(undefined4 *)(lVar42 + 0x10 + lVar45 * 4);
                        }
                        else {
LAB_00150caf:
                          lVar45 = (long)(int)uVar11;
                          if ((*(char *)(lVar27 + 1 + lVar45) == '\0') ||
                             (*(char *)(lVar27 + lVar45) == '\0')) {
                            uVar25 = UFPC::Merge(*(uint *)(lVar42 + -8 + lVar45 * 4),
                                                 *(uint *)(lVar42 + 8 + lVar45 * 4));
                          }
                          else {
                            uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                          }
                          *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                        }
                        goto LAB_001507a4;
                      }
                      if (cVar1 != '\0') goto LAB_00150472;
                      if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar25 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                      }
                      else {
                        uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                      }
LAB_00150680:
                      *(uint *)(lVar31 + uVar11 * 4) = uVar25;
                      lVar45 = (long)(int)uVar36;
                      uVar11 = lVar45 + 2;
                      if (local_a8 <= (int)uVar11) {
                        if (local_a8 < (int)uVar11) goto LAB_00150f29;
                        if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00150f9f;
                        if (*(char *)(lVar46 + 3 + lVar45) != '\0') goto LAB_00151030;
                        goto LAB_0015119b;
                      }
                      uVar36 = uVar11;
                      if (*(char *)(lVar6 + uVar11) != '\0') {
                        if (*(char *)(lVar45 + 3 + lVar46) != '\0') {
                          uVar25 = UFPC::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),
                                               *(uint *)(lVar31 + lVar45 * 4));
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
                          goto LAB_00150b8b;
                        }
                        if (*(char *)(lVar6 + 3 + lVar45) == '\0') {
                          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                               *(undefined4 *)(lVar31 + lVar45 * 4);
                          goto LAB_00150dff;
                        }
                        if (*(char *)(lVar45 + 4 + lVar46) != '\0') {
                          uVar25 = UFPC::Merge(*(uint *)(lVar42 + 0x10 + lVar45 * 4),
                                               *(uint *)(lVar31 + lVar45 * 4));
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
                          goto LAB_001507a4;
                        }
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) =
                             *(undefined4 *)(lVar31 + lVar45 * 4);
LAB_0015097f:
                        while( true ) {
                          iVar14 = (int)uVar11;
                          uVar25 = iVar14 + 2;
                          if (local_a8 <= (int)uVar25) break;
                          lVar21 = (long)iVar14;
                          lVar45 = lVar21 + 2;
                          lVar20 = lVar21 << 0x20;
                          lVar37 = lVar7 + lVar21 * 4;
                          lVar19 = lVar40 + lVar21;
                          lVar32 = 0;
                          while( true ) {
                            if (*(char *)(lVar44 + lVar21 + -1 + lVar32) == '\0') {
                              uVar36 = (ulong)(uint)((int)lVar45 + (int)lVar32);
                              goto LAB_0015072c;
                            }
                            lVar9 = lVar20 >> 0x20;
                            lVar8 = lVar20 >> 0x1e;
                            if (*(char *)(lVar19 + -1 + lVar32) != '\0') break;
                            if (*(char *)(lVar44 + lVar21 + lVar32) == '\0') {
                              uVar25 = (int)lVar45 + (int)lVar32;
                              *(undefined4 *)(lVar37 + lVar32 * 4) = *(undefined4 *)(lVar31 + lVar8)
                              ;
                              goto LAB_00150a79;
                            }
                            if (*(char *)(lVar19 + lVar32) != '\0') {
                              if ((*(char *)(lVar32 + lVar39 + lVar21) == '\0') ||
                                 (*(char *)(lVar32 + -1 + lVar39 + lVar21) == '\0')) {
                                uVar25 = *(uint *)(lVar29 + lVar21 * 4 + lVar32 * 4);
                                uVar26 = *(uint *)(lVar31 + lVar8);
                              }
                              else {
                                if (*(char *)(lVar46 + lVar9) != '\0') {
                                  uVar11 = lVar45 + lVar32 & 0xffffffff;
                                  goto LAB_00150ac1;
                                }
                                uVar25 = *(uint *)(lVar29 + lVar21 * 4 + lVar32 * 4);
                                uVar26 = *(uint *)(lVar31 + lVar9 * 4);
                              }
                              uVar25 = UFPC::Merge(uVar25,uVar26);
                              *(uint *)(lVar37 + lVar32 * 4) = uVar25;
                              uVar11 = lVar45 + lVar32 & 0xffffffff;
                              goto LAB_001507a4;
                            }
                            *(undefined4 *)(lVar37 + lVar32 * 4) =
                                 *(undefined4 *)(lVar37 + -8 + lVar32 * 4);
                            lVar20 = lVar20 + 0x200000000;
                            lVar9 = lVar32 + lVar45;
                            lVar32 = lVar32 + 2;
                            if (lVar33 <= lVar9 + 2) {
                              uVar25 = iVar14 + (int)lVar32 + 2;
                              iVar14 = iVar14 + (int)lVar32;
                              goto LAB_00150e6a;
                            }
                          }
                          if (*(char *)(lVar32 + -1 + lVar39 + lVar21) == '\0') {
                            uVar25 = *(uint *)(lVar29 + lVar21 * 4 + -8 + lVar32 * 4);
                            uVar26 = *(uint *)(lVar31 + lVar8);
                          }
                          else {
                            if (*(char *)(lVar46 + lVar9) != '\0') {
                              uVar11 = lVar45 + lVar32 & 0xffffffff;
                              goto LAB_00150a45;
                            }
                            uVar25 = *(uint *)(lVar29 + lVar21 * 4 + -8 + lVar32 * 4);
                            uVar26 = *(uint *)(lVar31 + lVar9 * 4);
                          }
                          uVar25 = UFPC::Merge(uVar25,uVar26);
                          *(uint *)(lVar37 + lVar32 * 4) = uVar25;
                          uVar11 = lVar45 + lVar32 & 0xffffffff;
LAB_00150b8b:
                          iVar14 = (int)uVar11;
                          uVar25 = iVar14 + 2;
                          if (local_a8 <= (int)uVar25) {
LAB_00150ed5:
                            uVar11 = (ulong)uVar25;
                            lVar43 = (long)(int)uVar25;
                            if (local_a8 < (int)uVar25) {
                              if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00151131;
                              lVar29 = (long)iVar14;
                              if (*(char *)(lVar6 + 1 + lVar29) != '\0') goto LAB_00150f93;
                            }
                            else {
                              if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00151104;
                              if (*(char *)(lVar6 + 1 + (long)iVar14) != '\0') goto LAB_00150f57;
                              if (*(char *)(lVar46 + 3 + (long)iVar14) != '\0') {
                                if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_00151123;
                                goto LAB_001510a8;
                              }
                            }
                            if (*(char *)(lVar46 + lVar43) != '\0') goto LAB_00151123;
                            uVar12 = *(undefined4 *)(lVar42 + (long)iVar14 * 4);
                            goto LAB_00151128;
                          }
                          lVar20 = (long)iVar14;
                          lVar45 = lVar20 + 2;
                          lVar37 = lVar29 + lVar20 * 4;
                          lVar19 = lVar43 + lVar24 + 2 + lVar20;
                          lVar32 = lVar44 + lVar20;
                          lVar20 = lVar7 + lVar20 * 4;
                          lVar21 = 0;
LAB_00150bc3:
                          iVar28 = (int)lVar45;
                          iVar13 = (int)lVar21;
                          if (*(char *)(lVar32 + -1 + lVar21) == '\0') {
                            uVar36 = (ulong)(uint)(iVar28 + iVar13);
                            goto LAB_00150416;
                          }
                          if (*(char *)(lVar32 + -2 + lVar21) == '\0') {
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
                              uVar11 = lVar45 + lVar21;
                              if (*(char *)(lVar21 + lVar32) != '\0') {
                                if (*(char *)(lVar21 + 2 + lVar19) != '\0') {
                                  uVar11 = uVar11 & 0xffffffff;
                                  uVar36 = uVar11;
                                  if (*(char *)(lVar21 + lVar19) == '\0') goto LAB_00150caf;
                                  goto LAB_00150447;
                                }
                                if (*(char *)(lVar21 + lVar19) == '\0') {
                                  uVar36 = uVar11 & 0xffffffff;
                                  uVar25 = *(uint *)(lVar37 + -0x10 + lVar21 * 4);
                                  goto LAB_00150680;
                                }
                                uVar36 = uVar11 & 0xffffffff;
                                goto LAB_00150472;
                              }
                              if (*(char *)(lVar21 + lVar19) == '\0') {
                                uVar12 = *(undefined4 *)(lVar37 + -0x10 + lVar21 * 4);
                              }
                              else {
                                uVar12 = *(undefined4 *)(lVar37 + -8 + lVar21 * 4);
                              }
                              *(undefined4 *)(lVar20 + lVar21 * 4) = uVar12;
                              uVar11 = uVar11 & 0xffffffff;
                              goto LAB_00150dff;
                            }
                            if (*(char *)(lVar19 + lVar21) != '\0') goto code_r0x00150be8;
                            uVar11 = (ulong)(uint)(iVar28 + iVar13);
LAB_00150ce5:
                            lVar45 = (long)(int)uVar11;
                            cVar1 = *(char *)(lVar27 + lVar45);
joined_r0x00150a58:
                            if (cVar1 == '\0') {
                              uVar25 = UFPC::Merge(*(uint *)(lVar42 + -8 + lVar45 * 4),
                                                   *(uint *)(lVar42 + lVar45 * 4));
                            }
                            else {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_00150b8b;
                          }
                          uVar11 = (ulong)(uint)(iVar28 + iVar13);
LAB_00150c1d:
                          lVar45 = (long)(int)uVar11;
                          if (*(char *)(lVar45 + 1 + lVar46) != '\0') {
                            if (*(char *)(lVar46 + lVar45) == '\0') {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                              if (*(char *)(lVar27 + lVar45) != '\0') {
                                *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                                goto LAB_00150b8b;
                              }
                              uVar25 = UFPC::Merge(uVar25,*(uint *)(lVar31 + -8 + lVar45 * 4));
                            }
                            else {
                              uVar25 = *(uint *)(lVar42 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_00150b8b;
                          }
                          if (*(char *)(lVar6 + 1 + lVar45) == '\0') {
                            *(undefined4 *)(lVar31 + lVar45 * 4) =
                                 *(undefined4 *)(lVar31 + -8 + lVar45 * 4);
                            goto LAB_00150dff;
                          }
                          if (*(char *)(lVar45 + 2 + lVar46) != '\0') {
                            if (*(char *)(lVar27 + 1 + lVar45) == '\0') {
                              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
LAB_00150daa:
                              uVar25 = UFPC::Merge(uVar25,*(uint *)(lVar31 + -8 + lVar45 * 4));
                            }
                            else {
                              if (*(char *)(lVar46 + lVar45) == '\0') {
                                uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                                if (*(char *)(lVar27 + lVar45) == '\0') goto LAB_00150daa;
                                *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                                goto LAB_001507a4;
                              }
                              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
                            }
                            *(uint *)(lVar31 + lVar45 * 4) = uVar25;
                            goto LAB_001507a4;
                          }
                          *(undefined4 *)(lVar31 + lVar45 * 4) =
                               *(undefined4 *)(lVar31 + -8 + lVar45 * 4);
                        }
LAB_00150e6a:
                        uVar11 = (ulong)uVar25;
                        if (local_a8 < (int)uVar25) goto LAB_00150f29;
                        lVar43 = (long)(int)uVar25;
                        if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00150f9f;
                        lVar6 = (long)iVar14;
                        if (*(char *)(lVar46 + 3 + lVar6) == '\0') {
                          uVar25 = *(uint *)(lVar31 + lVar6 * 4);
                          goto LAB_001511bf;
                        }
                        if ((*(char *)(lVar27 + lVar43) != '\0') &&
                           (*(char *)(lVar46 + lVar6) != '\0')) goto LAB_00150eb9;
                        uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                        uVar26 = *(uint *)(lVar31 + lVar6 * 4);
                        goto LAB_001511ba;
                      }
LAB_0015072c:
                      iVar14 = (int)uVar36;
                      uVar11 = (ulong)iVar14;
                      if (*(char *)(uVar11 + 1 + lVar6) != '\0') {
                        if (*(char *)(lVar46 + 1 + uVar11) != '\0') goto LAB_00150742;
                        uVar11 = (ulong)iVar14;
                        if (*(char *)(uVar11 + 2 + lVar46) != '\0') goto LAB_00150777;
LAB_00150782:
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar25 = UFPC::length_;
                        UFPC::length_ = UFPC::length_ + 1;
                        goto LAB_00150680;
                      }
                    }
                    if (local_a8 < (int)uVar11) {
                      if (*(char *)(lVar6 + uVar11) == '\0') {
                        *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = 0;
                        return;
                      }
LAB_0015116f:
                      if (*(char *)(lVar46 + uVar11) == '\0') {
                        if (*(char *)(lVar46 + 1 + lVar45) == '\0') {
                          UFPC::P_[UFPC::length_] = UFPC::length_;
                          uVar25 = UFPC::length_ + 1;
                          *(uint *)(lVar31 + 8 + lVar45 * 4) = UFPC::length_;
                          UFPC::length_ = uVar25;
                          return;
                        }
                        uVar12 = *(undefined4 *)(lVar42 + lVar45 * 4);
                        goto LAB_0015117b;
                      }
                    }
                    else {
                      if (*(char *)(lVar6 + uVar11) == '\0') goto LAB_00151104;
                      if (*(char *)(lVar46 + 3 + lVar45) == '\0') goto LAB_0015116f;
                      if ((*(char *)(lVar46 + uVar11) == '\0') &&
                         (*(char *)(lVar46 + 1 + lVar45) != '\0')) {
LAB_001510a8:
                        lVar43 = (long)(int)uVar11;
                        cVar1 = *(char *)(lVar27 + lVar43);
                        goto joined_r0x001510b7;
                      }
                    }
                    uVar12 = *(undefined4 *)(lVar42 + 8 + lVar45 * 4);
LAB_0015117b:
                    *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = uVar12;
                    return;
                  }
                } while (*(char *)(lVar46 + 1 + uVar11) != '\0');
                goto LAB_00150430;
              }
              if (*(char *)(lVar46 + 4 + (lVar21 >> 0x20)) == '\0') goto LAB_00150472;
LAB_00150447:
              lVar45 = (long)(int)uVar36;
              if (*(char *)(lVar27 + 1 + lVar45) == '\0') goto LAB_00150529;
LAB_00150460:
              uVar25 = *(uint *)(lVar42 + 8 + lVar45 * 4);
            } while( true );
          }
          *(undefined4 *)(lVar31 + 8 + lVar45 * 4) = *(undefined4 *)(lVar31 + lVar45 * 4);
          goto LAB_00150dff;
        }
        if ((int)uVar25 <= local_a8) {
          if (*(char *)(lVar6 + uVar11) != '\0') {
            if (*(char *)(lVar46 + 3 + lVar45) == '\0') {
LAB_0015119b:
              uVar25 = *(uint *)(lVar31 + lVar45 * 4);
            }
            else {
              if (*(char *)(lVar27 + uVar11) != '\0') {
LAB_00150eb9:
                lVar43 = (long)(int)uVar25;
                cVar1 = *(char *)(lVar27 + -1 + lVar43);
joined_r0x001510b7:
                if (cVar1 == '\0') {
                  uVar25 = *(uint *)(lVar42 + -8 + lVar43 * 4);
                  uVar26 = *(uint *)(lVar42 + lVar43 * 4);
LAB_001511ba:
                  uVar25 = UFPC::Merge(uVar25,uVar26);
                }
                else {
LAB_00150f71:
                  uVar25 = *(uint *)(lVar42 + lVar43 * 4);
                }
LAB_001511bf:
                *(uint *)(lVar31 + lVar43 * 4) = uVar25;
                return;
              }
LAB_00151030:
              uVar25 = UFPC::Merge(*(uint *)(lVar42 + 8 + lVar45 * 4),*(uint *)(lVar31 + lVar45 * 4)
                                  );
            }
            *(uint *)(lVar31 + 8 + lVar45 * 4) = uVar25;
            return;
          }
LAB_00150f9f:
          lVar43 = (long)(int)uVar11;
          if (*(char *)(lVar43 + 1 + lVar6) == '\0') goto LAB_00151131;
          cVar1 = *(char *)(lVar46 + 1 + lVar43);
          goto joined_r0x00150fb3;
        }
LAB_00150f29:
        lVar43 = (long)(int)uVar11;
        if (*(char *)(lVar6 + lVar43) == '\0') goto LAB_00151131;
        uVar12 = *(undefined4 *)(lVar31 + -8 + lVar43 * 4);
        goto LAB_00151128;
      }
      if (*(char *)(lVar46 + lVar45) == '\0') {
        UFPC::P_[UFPC::length_] = UFPC::length_;
        uVar25 = UFPC::length_ + 1;
        *(uint *)(lVar31 + lVar45 * 4) = UFPC::length_;
        UFPC::length_ = uVar25;
      }
      else {
        *(undefined4 *)(lVar31 + lVar45 * 4) = *(undefined4 *)(lVar42 + lVar45 * 4);
      }
LAB_00150dff:
      iVar14 = (int)uVar11;
      uVar11 = (ulong)(iVar14 + 2U);
    } while ((int)(iVar14 + 2U) < local_a8);
  }
  iVar14 = (int)uVar11;
  lVar43 = (long)iVar14;
  if (local_a8 < iVar14) {
    if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_00151131:
      *(undefined4 *)(lVar31 + lVar43 * 4) = 0;
      return;
    }
  }
  else {
    if (*(char *)(lVar6 + lVar43) == '\0') {
LAB_00151104:
      iVar14 = (int)uVar11;
      lVar43 = (long)iVar14;
      if (*(char *)(lVar6 + 1 + lVar43) == '\0') goto LAB_00151131;
    }
    lVar43 = (long)iVar14;
    if (*(char *)(lVar46 + 1 + lVar43) != '\0') goto LAB_00151123;
  }
  lVar43 = (long)iVar14;
  cVar1 = *(char *)(lVar46 + lVar43);
joined_r0x00150fb3:
  if (cVar1 == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar25 = UFPC::length_ + 1;
    *(uint *)(lVar31 + lVar43 * 4) = UFPC::length_;
    UFPC::length_ = uVar25;
    return;
  }
LAB_00151123:
  uVar12 = *(undefined4 *)(lVar42 + lVar43 * 4);
LAB_00151128:
  *(undefined4 *)(lVar31 + lVar43 * 4) = uVar12;
  return;
LAB_0014d189:
  uVar12 = 0;
LAB_0014d19e:
  *(undefined4 *)(lVar31 + lVar29 * 4) = uVar12;
  uVar26 = uVar25;
LAB_0014d1a2:
  uVar25 = uVar26 + 2;
  if (iVar14 <= (int)uVar25) goto LAB_0014d1b0;
  goto LAB_0014d0f7;
code_r0x0014d356:
  uVar11 = lVar37 + lVar39 & 0xffffffff;
  goto LAB_0014d29f;
LAB_0014ef5e:
  *(undefined4 *)(lVar32 + lVar39 + 8 + lVar22 * 4) = *(undefined4 *)(lVar40 + lVar34);
  local_b0 = (ulong)(uint)(iVar28 + iVar13);
LAB_0014f3fb:
  lVar21 = (long)(int)local_b0;
  local_b0 = lVar21 + 2;
  if (local_a8 <= (int)local_b0) {
    uVar11 = local_b0 & 0xffffffff;
    if (local_a8 < (int)local_b0) {
      if (*(char *)(lVar37 + uVar11) == '\0') {
LAB_0014f496:
        iVar14 = (int)local_b0;
        local_b0 = local_b0 & 0xffffffff;
        if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014fd1d;
LAB_0014f4a3:
        local_b0 = (ulong)iVar14;
        if (*(char *)(lVar19 + -1 + local_b0) != '\0') goto LAB_0014fc48;
        goto LAB_0014fcfa;
      }
      uVar36 = local_b0;
      if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d6d5;
    }
    else {
      if (*(char *)(lVar37 + uVar11) == '\0') {
        if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0014fcdf;
        if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
LAB_0014f662:
          iVar14 = (int)local_b0;
          goto LAB_0014f4a3;
        }
      }
      if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_0014f508:
        uVar35 = (uint)local_b0;
        goto LAB_0014d672;
      }
      if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
        if (*(char *)(lVar27 + lVar21) == '\0') {
LAB_0014e6eb:
          uVar35 = *(uint *)(lVar24 + uVar11 * 4);
          uVar5 = *(uint *)(lVar40 + lVar21 * 4);
          goto LAB_0014f626;
        }
LAB_0014f4dd:
        uVar35 = (uint)local_b0;
        if (*(char *)(lVar20 + -1 + (long)(int)uVar35) != '\0') goto LAB_0014fc32;
        uVar11 = local_b0 & 0xffffffff;
        uVar5 = *(uint *)(lVar24 + uVar11 * 4);
        uVar35 = *(uint *)(lVar40 + -8 + (long)(int)uVar35 * 4);
        goto LAB_0014e1f7;
      }
    }
    if (*(char *)(lVar27 + uVar11) != '\0') goto LAB_0014f5ed;
LAB_0014f60b:
    *(undefined4 *)(lVar40 + uVar11 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
    goto LAB_0014fd2a;
  }
  if (*(char *)(lVar37 + local_b0) == '\0') {
    if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014f5c8;
    uVar11 = local_b0;
    if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0014df5a;
    if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d7b4;
    if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014f562;
      uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_0014f28f;
    }
  }
  else {
    uVar11 = local_b0;
    if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d6a9;
    if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
      if (*(char *)(lVar27 + lVar21) == '\0') {
        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
        goto LAB_0014fa79;
      }
LAB_0014f433:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        goto LAB_0014f44f;
      }
LAB_0014f329:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014fec0;
      cVar1 = *(char *)(lVar20 + lVar21);
      uVar35 = *(uint *)(lVar24 + lVar21 * 4);
      goto joined_r0x0014f343;
    }
    if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
      if (*(char *)(lVar27 + local_b0) == '\0') goto LAB_0014f7ae;
      if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014f789;
      uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_0014e50b;
    }
  }
  if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
    if (*(char *)(lVar27 + 2 + lVar21) == '\0') goto LAB_0014f7f0;
    if (*(char *)(lVar27 + lVar21) == '\0') {
      uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
      *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      goto LAB_0014d814;
    }
LAB_0014f7d4:
    lVar21 = (long)(int)local_b0;
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
    if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
      uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
      *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    }
    else {
      *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    }
LAB_0014d814:
    lVar21 = (long)(int)local_b0;
    local_b0 = lVar21 + 2;
    if (local_a8 <= (int)local_b0) {
      uVar11 = local_b0;
      if (local_a8 < (int)local_b0) goto LAB_0014f2ca;
      uVar11 = local_b0 & 0xffffffff;
      if (*(char *)(lVar37 + uVar11) == '\0') {
        if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0014eed1;
        if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_0014f60b;
      }
      if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_0014f60b;
      if (*(char *)(lVar20 + uVar11) != '\0') goto LAB_0014f5f7;
      goto LAB_0014e6eb;
    }
    if (*(char *)(lVar37 + local_b0) == '\0') {
      if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014e83f;
      if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0014e7ee;
      if (*(char *)(lVar27 + 3 + lVar21) != '\0') {
        if (*(char *)(lVar20 + local_b0) == '\0') {
          uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
          goto LAB_0014f28f;
        }
LAB_0014f081:
        lVar21 = (long)(int)local_b0;
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        if (*(char *)(lVar20 + -1 + lVar21) != '\0') goto LAB_0014ff6d;
LAB_0014ddaf:
        uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
LAB_0014fe0e:
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
LAB_0014f28f:
        lVar21 = (long)(int)local_b0;
        local_b0 = lVar21 + 2;
        if (local_a8 <= (int)local_b0) {
          if (local_a8 < (int)local_b0) {
            uVar11 = local_b0 & 0xffffffff;
            goto LAB_0014f2ca;
          }
          uVar11 = local_b0 & 0xffffffff;
          if (*(char *)(lVar37 + uVar11) != '\0') goto LAB_0014fc28;
          uVar30 = local_b0;
          if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0014fcdc;
          if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_0014fc28;
          *(undefined4 *)(lVar40 + uVar11 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
          goto LAB_0014fd2a;
        }
        if (*(char *)(lVar37 + local_b0) == '\0') {
          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014d7a3;
          if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
            *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
LAB_0014dfc6:
            lVar21 = (long)(int)local_b0;
            local_b0 = lVar21 + 2;
            if ((int)local_b0 < local_a8) {
              if (*(char *)(lVar37 + local_b0) == '\0') {
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_0014dd86;
              }
              if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014db62;
LAB_0014dff1:
              lVar21 = (long)(int)local_b0;
              if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
                if ((*(char *)(lVar27 + lVar21) == '\0') &&
                   (*(char *)(lVar27 + -1 + lVar21) != '\0')) {
                  if (*(char *)(lVar20 + lVar21) == '\0') {
                    uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                         *(uint *)(lVar24 + lVar21 * 4));
                    uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                  }
                  else {
                    uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                         *(uint *)(lVar40 + -8 + lVar21 * 4));
                  }
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                }
                else {
                  uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                       *(uint *)(lVar40 + -8 + lVar21 * 4));
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                }
                goto LAB_0014fa79;
              }
              if (*(char *)(lVar37 + 1 + lVar21) == '\0') {
                if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                  local_b0 = local_b0 & 0xffffffff;
                  goto LAB_0014e3ef;
                }
                uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                     *(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_0014f3fb;
              }
              if (*(char *)(lVar21 + 2 + lVar27) == '\0') {
                if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
LAB_0014de90:
                  lVar21 = (long)(int)local_b0;
                  if (*(char *)(lVar27 + lVar21) == '\0') {
                    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4)
                    ;
LAB_0014e645:
                    do {
                      lVar21 = (long)(int)local_b0;
                      local_b0 = lVar21 + 2;
                      if (local_a8 <= (int)local_b0) {
                        uVar11 = local_b0;
                        if (local_a8 < (int)local_b0) goto LAB_0014f2ca;
                        uVar11 = local_b0 & 0xffffffff;
                        if (*(char *)(lVar37 + uVar11) == '\0') {
                          if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0014eed1;
                          if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_0014f60b;
                        }
                        if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_0014f60b;
                        goto LAB_0014e6eb;
                      }
                      if (*(char *)(lVar37 + local_b0) != '\0') {
                        if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
                          uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                               *(uint *)(lVar40 + lVar21 * 4));
                          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                          goto LAB_0014fa79;
                        }
                        if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014f3fb;
                        }
LAB_0014e77d:
                        if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014ecb5;
                        }
                        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),
                                             *(uint *)(lVar40 + lVar21 * 4));
                        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                        goto LAB_0014e8b5;
                      }
                      if (*(char *)(lVar19 + local_b0) != '\0') {
                        if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0014e7ee;
                        if (*(char *)(lVar27 + 3 + lVar21) == '\0') goto LAB_0014e77d;
                        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                             *(uint *)(lVar40 + lVar21 * 4));
                        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                        goto LAB_0014f28f;
                      }
LAB_0014e83f:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar21 + 1 + lVar37) != '\0') {
                        if (*(char *)(lVar27 + 1 + lVar21) != '\0') goto LAB_0014d7be;
                        if (*(char *)(lVar21 + 2 + lVar27) == '\0') goto LAB_0014e875;
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + 8 + lVar21 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014e8b5;
                      }
                      local_b0 = local_b0 & 0xffffffff;
LAB_0014da28:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar19 + 1 + lVar21) != '\0') {
                        UFPC::P_[UFPC::length_] = UFPC::length_;
                        uVar35 = UFPC::length_;
                        uVar5 = UFPC::length_ + 1;
                        *(uint *)(lVar40 + lVar21 * 4) = UFPC::length_;
                        UFPC::length_ = uVar5;
                        local_b0 = lVar21 + 2;
                        if ((int)local_b0 < local_a8) {
                          if (*(char *)(lVar37 + local_b0) != '\0') goto LAB_0014dff1;
                          if (*(char *)(lVar19 + local_b0) == '\0') goto LAB_0014de0b;
                          if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_0014dda1;
                          *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014dfc6;
                        }
                        uVar36 = local_b0 & 0xffffffff;
                        if (local_a8 < (int)local_b0) {
                          uVar11 = local_b0;
                          if (*(char *)(lVar37 + uVar36) != '\0') goto LAB_0014e0ed;
                          goto LAB_0014f2d7;
                        }
                        if (*(char *)(lVar37 + uVar36) != '\0') {
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014e0a3;
                        }
                        if (*(char *)(lVar19 + uVar36) == '\0') goto LAB_0014fcdf;
                        if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_0014e1db;
                        *(uint *)(lVar40 + uVar36 * 4) = uVar35;
                        goto LAB_0014fd2a;
                      }
                      *(undefined4 *)(lVar40 + lVar21 * 4) = 0;
                      uVar30 = lVar21 + 2;
                      if (local_a8 <= (int)uVar30) {
                        cVar1 = *(char *)(lVar37 + (uVar30 & 0xffffffff));
                        if ((int)uVar30 <= local_a8) {
                          if (cVar1 != '\0') goto LAB_0014e15a;
                          goto LAB_0014db1e;
                        }
                        if (cVar1 != '\0') goto LAB_0014e183;
                        goto LAB_0014dacd;
                      }
                      local_b0 = uVar30;
                      if (*(char *)(lVar37 + uVar30) == '\0') {
LAB_0014d749:
                        lVar21 = (long)(int)local_b0;
                        if (*(char *)(lVar19 + lVar21) != '\0') {
                          if (*(char *)(lVar37 + 1 + lVar21) == '\0') {
                            UFPC::P_[UFPC::length_] = UFPC::length_;
                            uVar35 = UFPC::length_;
                            goto LAB_0014dfc2;
                          }
                          uVar11 = local_b0 & 0xffffffff;
                          goto LAB_0014d7b4;
                        }
                        goto LAB_0014d7a3;
                      }
LAB_0014db62:
                      lVar21 = (long)(int)local_b0;
                      if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
                        if ((*(char *)(lVar27 + lVar21) != '\0') ||
                           (*(char *)(lVar27 + -1 + lVar21) == '\0')) {
                          *(undefined4 *)(lVar40 + lVar21 * 4) =
                               *(undefined4 *)(lVar24 + lVar21 * 4);
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014fa79;
                        }
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014feb2;
                      }
                      if (*(char *)(lVar37 + 1 + lVar21) != '\0') {
                        if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
                          if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014d7e8;
                          if (*(char *)(lVar27 + -1 + lVar21) != '\0') goto LAB_001500f3;
                          goto LAB_0014dbb0;
                        }
                        if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014d80c;
                        if (*(char *)(lVar27 + -1 + lVar21) == '\0') goto LAB_0014dbfe;
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + -8 + lVar21 * 4);
                        goto LAB_0014e645;
                      }
                      if (*(char *)(lVar27 + lVar21) == '\0') {
                        if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                          UFPC::P_[UFPC::length_] = UFPC::length_;
                          uVar35 = UFPC::length_ + 1;
                          *(uint *)(lVar40 + lVar21 * 4) = UFPC::length_;
                          UFPC::length_ = uVar35;
                          local_b0 = local_b0 & 0xffffffff;
                          goto LAB_0014dc8d;
                        }
                        *(undefined4 *)(lVar40 + lVar21 * 4) =
                             *(undefined4 *)(lVar24 + -8 + lVar21 * 4);
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014dc8d;
                      }
                      *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
                      local_b0 = local_b0 & 0xffffffff;
LAB_0014e50b:
                      while( true ) {
                        lVar21 = (long)(int)local_b0;
                        local_b0 = lVar21 + 2;
                        if (local_a8 <= (int)local_b0) {
                          uVar11 = local_b0 & 0xffffffff;
                          if (local_a8 < (int)local_b0) {
                            if (*(char *)(lVar37 + uVar11) == '\0') goto LAB_0014f496;
                            uVar36 = local_b0;
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d6d5;
                          }
                          else {
                            if (*(char *)(lVar37 + uVar11) == '\0') {
                              if (*(char *)(lVar19 + uVar11) == '\0') goto LAB_0014fcdf;
                              if (*(char *)(lVar37 + 3 + lVar21) == '\0') goto LAB_0014f662;
                            }
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014f508;
                            if (*(char *)(lVar27 + 3 + lVar21) != '\0') goto LAB_0014f4dd;
                          }
                          if (*(char *)(lVar27 + uVar11) != '\0') goto LAB_0014f5f7;
                          *(undefined4 *)(lVar40 + uVar11 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
                          goto LAB_0014fd2a;
                        }
                        if (*(char *)(lVar37 + local_b0) == '\0') break;
                        uVar11 = local_b0;
                        if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d6a9;
                        if (*(char *)(lVar21 + 3 + lVar27) != '\0') goto LAB_0014f433;
                        if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_0014e5dc;
                        if (*(char *)(lVar27 + local_b0) == '\0') {
LAB_0014f7ae:
                          *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                               *(undefined4 *)(lVar40 + lVar21 * 4);
LAB_0014dc8d:
                          while( true ) {
                            lVar21 = (long)(int)local_b0;
                            local_b0 = lVar21 + 2;
                            if (local_a8 <= (int)local_b0) {
                              cVar1 = *(char *)(lVar37 + (local_b0 & 0xffffffff));
                              if ((int)local_b0 <= local_a8) {
                                if (cVar1 != '\0') goto LAB_0014e1ca;
                                goto LAB_0014e1af;
                              }
                              if (cVar1 == '\0') goto LAB_0014f496;
                              uVar36 = local_b0;
                              if (*(char *)(lVar19 + 1 + lVar21) != '\0') goto LAB_0014e1e5;
                              goto LAB_0014d6d5;
                            }
                            if (*(char *)(lVar37 + local_b0) == '\0') goto LAB_0014dd86;
                            uVar11 = local_b0;
                            if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d6a9;
                            if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
                              uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                                                   *(uint *)(lVar40 + lVar21 * 4));
                              *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
                              goto LAB_0014fa79;
                            }
                            if (*(char *)(lVar37 + 3 + lVar21) != '\0') goto LAB_0014de1b;
LAB_0014e3ef:
                            lVar21 = (long)(int)local_b0;
                            if (*(char *)(lVar27 + lVar21) != '\0') break;
                            *(undefined4 *)(lVar40 + lVar21 * 4) =
                                 *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
                          }
                          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
LAB_0014e4c1:
                          uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                          *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                        }
                        else {
LAB_0014f789:
                          lVar21 = (long)(int)local_b0;
                          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
                          if (*(char *)(lVar20 + -1 + lVar21) == '\0') goto LAB_0014e4c1;
                          *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                        }
                      }
                      if (*(char *)(lVar19 + local_b0) == '\0') {
LAB_0014f5c8:
                        local_b0 = local_b0 & 0xffffffff;
                        goto LAB_0014d7a3;
                      }
                      uVar11 = local_b0;
                      if (*(char *)(lVar21 + 3 + lVar37) == '\0') goto LAB_0014df5a;
                      if (*(char *)(lVar19 + 1 + lVar21) == '\0') goto LAB_0014d7b4;
                      if (*(char *)(lVar27 + 3 + lVar21) != '\0') goto LAB_0014f562;
LAB_0014e5dc:
                      if (*(char *)(lVar21 + 4 + lVar27) != '\0') {
                        if (*(char *)(lVar20 + 3 + lVar21) != '\0') goto LAB_0014f6a0;
                        if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0014f868;
                        goto LAB_0014f93b;
                      }
                      if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0014f7d4;
LAB_0014f7f0:
                      *(undefined4 *)(lVar40 + 8 + lVar21 * 4) =
                           *(undefined4 *)(lVar40 + lVar21 * 4);
                      local_b0 = local_b0 & 0xffffffff;
                    } while( true );
                  }
                  uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar21 * 4),
                                       *(uint *)(lVar40 + -8 + lVar21 * 4));
                  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                  goto LAB_0014d814;
                }
                uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                     *(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_0014ecb5;
              }
              if (*(char *)(lVar27 + lVar21) != '\0') {
                cVar1 = *(char *)(lVar20 + 1 + lVar21);
                goto joined_r0x0014e14f;
              }
              if (*(char *)(lVar27 + -1 + lVar21) == '\0') {
                uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
                goto LAB_0014f6cb;
              }
              if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
                uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),
                                     *(uint *)(lVar24 + 8 + lVar21 * 4));
                uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
                *(uint *)(lVar40 + lVar21 * 4) = uVar35;
                goto LAB_0014e8b5;
              }
              if (*(char *)(lVar20 + lVar21) != '\0') goto LAB_0014f88f;
              uVar35 = *(uint *)(lVar24 + -8 + lVar21 * 4);
              goto LAB_0014f8a1;
            }
            cVar1 = *(char *)(lVar37 + (local_b0 & 0xffffffff));
            uVar30 = local_b0;
            if (local_a8 < (int)local_b0) {
              if (cVar1 == '\0') {
                local_b0 = local_b0 & 0xffffffff;
                goto LAB_0014f496;
              }
              local_b0 = local_b0 & 0xffffffff;
              if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_0014e183:
                local_b0 = (ulong)(int)uVar30;
                if (*(char *)(lVar27 + local_b0) != '\0') goto LAB_0014d6e2;
                if (*(char *)(lVar27 + -1 + local_b0) == '\0') goto LAB_0014fcfa;
                uVar12 = *(undefined4 *)(lVar24 + -8 + local_b0 * 4);
                goto LAB_0014fc4d;
              }
LAB_0014e0ed:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + -1 + uVar11) != '\0') {
                uVar5 = *(uint *)(lVar24 + -8 + uVar11 * 4);
                goto LAB_0014e1f2;
              }
LAB_0014e1e5:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + uVar11) == '\0') {
                uVar12 = *(undefined4 *)(lVar40 + -8 + uVar11 * 4);
                goto LAB_0014fc3f;
              }
            }
            else {
              if (cVar1 != '\0') {
                if (*(char *)(lVar19 + 1 + lVar21) == '\0') {
LAB_0014e15a:
                  uVar35 = (uint)uVar30;
                  local_b0 = (ulong)(int)uVar35;
                  if (*(char *)(lVar27 + 1 + local_b0) == '\0') goto LAB_0014e183;
                  if ((*(char *)(lVar27 + local_b0) != '\0') ||
                     (*(char *)(lVar27 + -1 + local_b0) == '\0')) goto LAB_0014d6e2;
                  goto LAB_0014ffca;
                }
LAB_0014e0a3:
                lVar37 = (long)(int)local_b0;
                local_b0 = local_b0 & 0xffffffff;
                if (*(char *)(lVar27 + 1 + lVar37) == '\0') goto LAB_0014e0ed;
                if (*(char *)(lVar27 + lVar37) == '\0') {
                  if (*(char *)(lVar27 + -1 + lVar37) == '\0') {
                    uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar37 * 4),
                                         *(uint *)(lVar40 + -8 + lVar37 * 4));
                    *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                  }
                  else {
                    if (*(char *)(lVar20 + lVar37) == '\0') {
                      uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar37 * 4),
                                           *(uint *)(lVar24 + lVar37 * 4));
                      uVar5 = *(uint *)(lVar40 + -8 + lVar37 * 4);
                    }
                    else {
                      uVar35 = *(uint *)(lVar24 + lVar37 * 4);
                      uVar5 = *(uint *)(lVar40 + -8 + lVar37 * 4);
                    }
                    uVar35 = UFPC::Merge(uVar35,uVar5);
                    *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                  }
                }
                else {
                  uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar37 * 4),
                                       *(uint *)(lVar40 + -8 + lVar37 * 4));
                  *(uint *)(lVar40 + lVar37 * 4) = uVar35;
                }
                goto LAB_0014fd2a;
              }
              local_b0 = local_b0 & 0xffffffff;
LAB_0014e1af:
              iVar14 = (int)local_b0;
              if (*(char *)(lVar19 + (local_b0 & 0xffffffff)) == '\0') goto LAB_0014fcdf;
              if (*(char *)(lVar37 + 1 + (long)iVar14) == '\0') goto LAB_0014f4a3;
LAB_0014e1ca:
              uVar35 = (uint)local_b0;
              if (*(char *)(lVar19 + -1 + (long)(int)uVar35) == '\0') goto LAB_0014d672;
LAB_0014e1db:
              uVar11 = (ulong)(int)local_b0;
              if (*(char *)(lVar27 + 1 + uVar11) == '\0') goto LAB_0014e1e5;
            }
            uVar5 = *(uint *)(lVar24 + uVar11 * 4);
            goto LAB_0014e1f2;
          }
LAB_0014fde7:
          uVar11 = local_b0 & 0xffffffff;
          if (*(char *)(lVar27 + 1 + (long)(int)local_b0) != '\0') goto LAB_0014fdf8;
          goto LAB_0014f35d;
        }
LAB_0014f31c:
        lVar21 = (long)(int)local_b0;
        if (*(char *)(lVar21 + 1 + lVar27) != '\0') {
          local_b0 = local_b0 & 0xffffffff;
          goto LAB_0014f329;
        }
        if (*(char *)(lVar37 + 1 + lVar21) != '\0') goto LAB_0014f35d;
        *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
        goto LAB_0014f3fb;
      }
    }
    else {
      if (*(char *)(lVar21 + 3 + lVar27) != '\0') {
        if (*(char *)(lVar20 + local_b0) != '\0') goto LAB_0014ef3d;
        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
        goto LAB_0014fa79;
      }
      if (*(char *)(lVar37 + 3 + lVar21) == '\0') {
        *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
        local_b0 = local_b0 & 0xffffffff;
        goto LAB_0014f3fb;
      }
    }
    if (*(char *)(lVar21 + 4 + lVar27) == '\0') {
      *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
      local_b0 = local_b0 & 0xffffffff;
      goto LAB_0014ecb5;
    }
    if ((*(char *)(lVar20 + 3 + lVar21) != '\0') && (*(char *)(lVar20 + local_b0) != '\0'))
    goto LAB_0014eea9;
    uVar35 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
    *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
    goto LAB_0014e8b5;
  }
  if (*(char *)(lVar20 + 3 + lVar21) == '\0') {
    if (*(char *)(lVar27 + local_b0) != '\0') {
      if (*(char *)(lVar27 + lVar21) == '\0') {
        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),
                             *(uint *)(lVar24 + 0x10 + lVar21 * 4));
        uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + lVar21 * 4));
        *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
      }
      else {
LAB_0014f868:
        lVar21 = (long)(int)local_b0;
        cVar1 = *(char *)(lVar20 + -1 + lVar21);
joined_r0x0014e14f:
        if (cVar1 == '\0') {
          uVar35 = *(uint *)(lVar24 + lVar21 * 4);
LAB_0014f8a1:
          uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar24 + 8 + lVar21 * 4));
          uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        else {
LAB_0014f88f:
          uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
          uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        uVar35 = UFPC::Merge(uVar35,uVar5);
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
      }
      goto LAB_0014e8b5;
    }
  }
  else if (*(char *)(lVar27 + lVar21) != '\0') {
LAB_0014f6a0:
    iVar14 = (int)local_b0;
    local_b0 = local_b0 & 0xffffffff;
    lVar21 = (long)iVar14;
    if (*(char *)(lVar20 + -1 + lVar21) != '\0') goto LAB_0014f388;
LAB_0014f6c0:
    uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
LAB_0014f6cb:
    uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
LAB_0014f6d0:
    uVar35 = UFPC::Merge(uVar35,uVar5);
    goto LAB_0014f706;
  }
LAB_0014f93b:
  uVar35 = UFPC::Merge(*(uint *)(lVar24 + 0x10 + lVar21 * 4),*(uint *)(lVar40 + lVar21 * 4));
  *(uint *)(lVar40 + 8 + lVar21 * 4) = uVar35;
  goto LAB_0014e8b5;
LAB_0014e875:
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar35 = UFPC::length_ + 1;
  *(uint *)(lVar40 + lVar21 * 4) = UFPC::length_;
  UFPC::length_ = uVar35;
  local_b0 = local_b0 & 0xffffffff;
  goto LAB_0014e645;
LAB_0014f562:
  lVar21 = (long)(int)local_b0;
  uVar11 = local_b0;
  if (*(char *)(lVar20 + -1 + lVar21) == '\0') {
    uVar35 = UFPC::Merge(*(uint *)(lVar24 + lVar21 * 4),*(uint *)(lVar40 + -8 + lVar21 * 4));
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    goto LAB_0014f28f;
  }
LAB_0014fdf8:
  lVar21 = (long)(int)uVar11;
  local_b0 = uVar11;
  if (*(char *)(lVar27 + lVar21) == '\0') {
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
    if (*(char *)(lVar20 + lVar21) == '\0') goto LAB_0014ddaf;
LAB_0014ff6d:
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
    goto LAB_0014f28f;
  }
  uVar35 = *(uint *)(lVar24 + lVar21 * 4);
  goto LAB_0014fe0e;
LAB_0014dd86:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar19 + lVar21) != '\0') {
    uVar11 = local_b0;
    if (*(char *)(lVar37 + 1 + lVar21) == '\0') goto LAB_0014df5a;
    if (*(char *)(lVar19 + -1 + lVar21) != '\0') {
LAB_0014dda1:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar27 + 1 + lVar21) != '\0') {
        uVar35 = *(uint *)(lVar24 + lVar21 * 4);
        goto LAB_0014ddaf;
      }
LAB_0014de1b:
      lVar21 = (long)(int)local_b0;
      if (*(char *)(lVar21 + 2 + lVar27) == '\0') {
        local_b0 = local_b0 & 0xffffffff;
        goto LAB_0014de90;
      }
      if (*(char *)(lVar20 + 1 + lVar21) == '\0') {
        if (*(char *)(lVar27 + lVar21) == '\0') {
          uVar5 = *(uint *)(lVar24 + 8 + lVar21 * 4);
          uVar35 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        else {
          uVar5 = UFPC::Merge(*(uint *)(lVar24 + lVar21 * 4),*(uint *)(lVar24 + 8 + lVar21 * 4));
          uVar35 = *(uint *)(lVar40 + -8 + lVar21 * 4);
        }
        uVar35 = UFPC::Merge(uVar5,uVar35);
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
        local_b0 = local_b0 & 0xffffffff;
      }
      else {
        uVar35 = UFPC::Merge(*(uint *)(lVar24 + 8 + lVar21 * 4),*(uint *)(lVar40 + -8 + lVar21 * 4))
        ;
        *(uint *)(lVar40 + lVar21 * 4) = uVar35;
      }
      goto LAB_0014e8b5;
    }
    goto LAB_0014d7b4;
  }
LAB_0014de0b:
  local_b0 = local_b0 & 0xffffffff;
LAB_0014d7a3:
  uVar11 = local_b0 & 0xffffffff;
  if (*(char *)(lVar37 + 1 + (long)(int)local_b0) != '\0') goto LAB_0014d7b4;
  goto LAB_0014da28;
LAB_0014df5a:
  local_b0 = uVar11 & 0xffffffff;
  lVar21 = (long)(int)uVar11;
  if (*(char *)(lVar19 + -1 + lVar21) == '\0') {
    UFPC::P_[UFPC::length_] = UFPC::length_;
    uVar35 = UFPC::length_;
LAB_0014dfc2:
    UFPC::length_ = uVar35 + 1;
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  else {
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
  }
  goto LAB_0014dfc6;
LAB_0014d7b4:
  lVar21 = (long)(int)uVar11;
  local_b0 = uVar11;
  if (*(char *)(lVar27 + 1 + lVar21) != '\0') {
LAB_0014d7be:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
    goto LAB_0014f28f;
  }
LAB_0014d7cb:
  iVar14 = (int)local_b0;
  local_b0 = local_b0 & 0xffffffff;
  lVar21 = (long)iVar14;
  if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
    if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014d7e8;
LAB_0014dbb0:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + 8 + lVar21 * 4);
    goto LAB_0014e8b5;
  }
  if (*(char *)(lVar27 + lVar21) != '\0') {
LAB_0014d80c:
    *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar24 + lVar21 * 4);
    goto LAB_0014d814;
  }
LAB_0014dbfe:
  UFPC::P_[UFPC::length_] = UFPC::length_;
  uVar35 = UFPC::length_ + 1;
  *(uint *)(lVar40 + lVar21 * 4) = UFPC::length_;
  UFPC::length_ = uVar35;
  goto LAB_0014e645;
LAB_001500f3:
  lVar21 = (long)(int)local_b0;
  if ((*(char *)(lVar20 + 1 + lVar21) == '\0') || (*(char *)(lVar20 + lVar21) == '\0')) {
    uVar35 = UFPC::Merge(*(uint *)(lVar24 + -8 + lVar21 * 4),*(uint *)(lVar24 + 8 + lVar21 * 4));
  }
  else {
    uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_0014e8b5;
LAB_0014e7ee:
  *(undefined4 *)(lVar40 + 8 + lVar21 * 4) = *(undefined4 *)(lVar40 + lVar21 * 4);
  local_b0 = local_b0 & 0xffffffff;
  goto LAB_0014dfc6;
LAB_0014f35d:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar27 + 2 + lVar21) != '\0') {
LAB_0014f370:
    lVar21 = (long)(int)local_b0;
    if (*(char *)(lVar20 + 1 + lVar21) == '\0') goto LAB_0014f6c0;
    goto LAB_0014f388;
  }
  *(undefined4 *)(lVar40 + lVar21 * 4) = *(undefined4 *)(lVar40 + -8 + lVar21 * 4);
  goto LAB_0014ecb5;
LAB_0014ef3d:
  lVar21 = (long)(int)local_b0;
  cVar1 = *(char *)(lVar20 + -1 + lVar21);
  uVar35 = *(uint *)(lVar24 + lVar21 * 4);
joined_r0x0014f343:
  if (cVar1 == '\0') {
LAB_0014f44f:
    uVar5 = *(uint *)(lVar40 + -8 + lVar21 * 4);
    goto LAB_0014fed2;
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_0014fa79;
LAB_0014f388:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar27 + lVar21) != '\0') goto LAB_0014d7fb;
  cVar1 = *(char *)(lVar20 + lVar21);
  uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
joined_r0x0014eec2:
  if (cVar1 == '\0') {
    uVar35 = UFPC::Merge(uVar35,*(uint *)(lVar40 + -8 + lVar21 * 4));
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  else {
    *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  }
  goto LAB_0014e8b5;
LAB_0014eea9:
  lVar21 = (long)(int)local_b0;
  cVar1 = *(char *)(lVar20 + -1 + lVar21);
  uVar35 = *(uint *)(lVar24 + 8 + lVar21 * 4);
  goto joined_r0x0014eec2;
LAB_0014fe8b:
  local_b0 = (ulong)(uint)(iVar28 + (int)lVar10);
LAB_0014feb2:
  lVar21 = (long)(int)local_b0;
  if (*(char *)(lVar20 + lVar21) == '\0') {
    uVar35 = *(uint *)(lVar24 + -8 + lVar21 * 4);
    uVar5 = *(uint *)(lVar24 + lVar21 * 4);
LAB_0014fed2:
    uVar35 = UFPC::Merge(uVar35,uVar5);
  }
  else {
LAB_0014fec0:
    uVar35 = *(uint *)(lVar24 + lVar21 * 4);
  }
  *(uint *)(lVar40 + lVar21 * 4) = uVar35;
  goto LAB_0014fa79;
code_r0x0015081d:
  if (*(char *)(lVar37 + lVar32) == '\0') {
    uVar11 = (ulong)(iVar14 + iVar28 + 2);
    *(undefined4 *)(lVar45 + lVar32 * 4) = *(undefined4 *)(lVar31 + (lVar21 >> 0x1e));
    goto LAB_0015097f;
  }
  uVar25 = *(uint *)(lVar19 + lVar32 * 4);
  if (*(char *)(lVar39 + lVar20 + lVar32) == '\0') {
    uVar25 = UFPC::Merge(uVar25,*(uint *)(lVar45 + -8 + lVar32 * 4));
  }
  *(uint *)(lVar45 + lVar32 * 4) = uVar25;
  lVar21 = lVar21 + 0x200000000;
  lVar9 = lVar20 + lVar32;
  lVar32 = lVar32 + 2;
  if (lVar33 <= lVar9 + 4) {
    uVar25 = iVar14 + (int)lVar32 + 2;
    iVar14 = iVar14 + (int)lVar32;
    goto LAB_00150f21;
  }
  goto LAB_001507f9;
code_r0x00150be8:
  *(undefined4 *)(lVar20 + lVar21 * 4) = *(undefined4 *)(lVar37 + -8 + lVar21 * 4);
  lVar9 = lVar45 + lVar21;
  lVar21 = lVar21 + 2;
  if (lVar33 <= lVar9 + 2) {
    uVar25 = iVar14 + (int)lVar21 + 2;
    iVar14 = iVar14 + (int)lVar21;
    goto LAB_00150ed5;
  }
  goto LAB_00150bc3;
LAB_00150777:
  *(undefined4 *)(lVar31 + uVar11 * 4) = *(undefined4 *)(lVar42 + 8 + uVar11 * 4);
  uVar11 = uVar36;
  goto LAB_001507a4;
LAB_00150529:
  uVar25 = *(uint *)(lVar42 + lVar45 * 4);
  uVar26 = *(uint *)(lVar42 + 8 + lVar45 * 4);
  goto LAB_00150533;
}

Assistant:

void FirstScan()
	{
		const int h = img_.rows;
		const int w = img_.cols;

		e_rows = h & 0xfffffffe;
		o_rows = h % 2 == 1;
		e_cols = w & 0xfffffffe;
		o_cols = w % 2 == 1;

		LabelsSolver::Setup(); // Labels solver initialization

							   // We work with 2x2 blocks
							   // +-+-+-+
							   // |P|Q|R|
							   // +-+-+-+
							   // |S|X|
							   // +-+-+

							   // The pixels are named as follows
							   // +---+---+---+
							   // |a b|c d|e f|
							   // |g h|i j|k l|
							   // +---+---+---+
							   // |m n|o p|
							   // |q r|s t|
							   // +---+---+

							   // Pixels a, f, l, q are not needed, since we need to understand the
							   // the connectivity between these blocks and those pixels only matter
							   // when considering the outer connectivities

							   // A bunch of defines used to check if the pixels are foreground,
							   // without going outside the image limits.

							   // First scan

		// Define Conditions and Actions
		{
#define CONDITION_B img_row_prev_prev[c-1]>0
#define CONDITION_C img_row_prev_prev[c]>0
#define CONDITION_D img_row_prev_prev[c+1]>0
#define CONDITION_E img_row_prev_prev[c+2]>0

#define CONDITION_G img_row_prev[c-2]>0
#define CONDITION_H img_row_prev[c-1]>0
#define CONDITION_I img_row_prev[c]>0
#define CONDITION_J img_row_prev[c+1]>0
#define CONDITION_K img_row_prev[c+2]>0

#define CONDITION_M img_row[c-2]>0
#define CONDITION_N img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P img_row[c+1]>0

#define CONDITION_R img_row_fol[c-1]>0
#define CONDITION_S img_row_fol[c]>0
#define CONDITION_T img_row_fol[c+1]>0

			// Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; 
							   // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); 
							   //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2];
							   // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c];
							   // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2];
							   // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; 
							   // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]);
							   //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]);
							   // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]);
							   // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]);
							   // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]);
							   // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]);
							   // Action 13: Merge labels of block P, Q and R
#define ACTION_13 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row_prev_prev[c + 2]);
							   // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]);
							   //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
							   //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]);
		}

		if (h == 1) {
			// Single line
			// int r = 0;
			const unsigned char* const img_row = img_.ptr<unsigned char>(0);
			unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
			int c = -2;
#include "labeling_bolelli_2019_forest_sl.inc.h"
		}
		else {
			// More than one line

			// First couple of lines
			{
				// int r = 0;
				const unsigned char* const img_row = img_.ptr<unsigned char>(0);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(0);
				int c = -2;

#include "labeling_bolelli_2019_forest_fl.inc.h"
			}

			// Every other line but the last one if image has an odd number of rows
			for (int r = 2; r < e_rows; r += 2) {
				// Get rows pointer
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				const unsigned char* const img_row_fol = (unsigned char*)(((char*)img_row) + img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

				int c = -2;
				goto tree_0;

#include "labeling_bolelli_2019_forest.inc.h"
			}

			// Last line (in case the rows are odd)
			if (o_rows)
			{
				int r = h - 1;
				const unsigned char* const img_row = img_.ptr<unsigned char>(r);
				const unsigned char* const img_row_prev = (unsigned char*)(((char*)img_row) - img_.step.p[0]);
				const unsigned char* const img_row_prev_prev = (unsigned char*)(((char*)img_row_prev) - img_.step.p[0]);
				unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
				unsigned* const img_labels_row_prev_prev = (unsigned*)(((char*)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);
				int c = -2;
#include "labeling_bolelli_2019_forest_ll.inc.h"
			}
		}


		// Undef Conditions and Actions
		{
#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
		}
	}